

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O1

double __thiscall chrono::ChFunction::Get_y_dN(ChFunction *this,double x,int derivate)

{
  long lVar1;
  double dVar2;
  
  lVar1 = 0x20;
  if ((uint)derivate < 3) {
    lVar1 = (ulong)(uint)derivate * 8 + 0x20;
  }
  dVar2 = (double)(**(code **)((long)this->_vptr_ChFunction + lVar1))();
  return dVar2;
}

Assistant:

double ChFunction::Get_y_dN(double x, int derivate) const {
    switch (derivate) {
        case 0:
            return Get_y(x);
        case 1:
            return Get_y_dx(x);
        case 2:
            return Get_y_dxdx(x);
        default:
            return Get_y(x);
    }
}